

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> *field)

{
  pointer *pppEVar1;
  size_t *psVar2;
  pointer *pppFVar3;
  pointer *pppMVar4;
  pointer *pppGVar5;
  pointer *pppTVar6;
  pointer *pppIVar7;
  _Head_base<0UL,_wabt::Import_*,_false> _Var8;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  iterator __position_02;
  iterator __position_03;
  ImportModuleField *pIVar9;
  iterator __position_04;
  ModuleField *pMVar10;
  ModuleFieldList *pMVar11;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  *p_Var12;
  int iVar13;
  ulong uVar14;
  _Head_base<0UL,_wabt::Import_*,_false> local_60;
  Import *import;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  
  _Var8._M_head_impl =
       *(Import **)
        &(((field->_M_t).
           super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->import)._M_t.
         super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>;
  local_60._M_head_impl = _Var8._M_head_impl;
  switch((_Var8._M_head_impl)->kind_) {
  case First:
    __position._M_current =
         (this->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar14 = (long)__position._M_current -
             (long)(this->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    import = _Var8._M_head_impl + 1;
    if (__position._M_current ==
        (this->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Func*,std::allocator<wabt::Func*>>::_M_realloc_insert<wabt::Func*>
                ((vector<wabt::Func*,std::allocator<wabt::Func*>> *)&this->funcs,__position,
                 (Func **)&import);
    }
    else {
      *__position._M_current = (Func *)import;
      pppFVar3 = &(this->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppFVar3 = *pppFVar3 + 1;
    }
    p_Var12 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
               *)&this->func_bindings;
    this->num_func_imports = this->num_func_imports + 1;
    break;
  case Table:
    __position_03._M_current =
         (this->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar14 = (long)__position_03._M_current -
             (long)(this->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    import = _Var8._M_head_impl + 1;
    if (__position_03._M_current ==
        (this->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Table*,std::allocator<wabt::Table*>>::_M_realloc_insert<wabt::Table*>
                ((vector<wabt::Table*,std::allocator<wabt::Table*>> *)&this->tables,__position_03,
                 (Table **)&import);
    }
    else {
      *__position_03._M_current = (Table *)import;
      pppTVar6 = &(this->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppTVar6 = *pppTVar6 + 1;
    }
    p_Var12 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
               *)&this->table_bindings;
    this->num_table_imports = this->num_table_imports + 1;
    break;
  case Memory:
    __position_01._M_current =
         (this->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    uVar14 = (long)__position_01._M_current -
             (long)(this->memories).
                   super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    import = _Var8._M_head_impl + 1;
    if (__position_01._M_current ==
        (this->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Memory*,std::allocator<wabt::Memory*>>::_M_realloc_insert<wabt::Memory*>
                ((vector<wabt::Memory*,std::allocator<wabt::Memory*>> *)&this->memories,
                 __position_01,(Memory **)&import);
    }
    else {
      *__position_01._M_current = (Memory *)import;
      pppMVar4 = &(this->memories).
                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppMVar4 = *pppMVar4 + 1;
    }
    p_Var12 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
               *)&this->memory_bindings;
    this->num_memory_imports = this->num_memory_imports + 1;
    break;
  case Global:
    __position_02._M_current =
         (this->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    uVar14 = (long)__position_02._M_current -
             (long)(this->globals).
                   super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    import = _Var8._M_head_impl + 1;
    if (__position_02._M_current ==
        (this->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Global*,std::allocator<wabt::Global*>>::_M_realloc_insert<wabt::Global*>
                ((vector<wabt::Global*,std::allocator<wabt::Global*>> *)&this->globals,__position_02
                 ,(Global **)&import);
    }
    else {
      *__position_02._M_current = (Global *)import;
      pppGVar5 = &(this->globals).
                  super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppGVar5 = *pppGVar5 + 1;
    }
    p_Var12 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
               *)&this->global_bindings;
    this->num_global_imports = this->num_global_imports + 1;
    break;
  case Except:
    __position_00._M_current =
         (this->excepts).super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    uVar14 = (long)__position_00._M_current -
             (long)(this->excepts).
                   super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
    import = _Var8._M_head_impl + 1;
    if (__position_00._M_current ==
        (this->excepts).super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Exception*,std::allocator<wabt::Exception*>>::
      _M_realloc_insert<wabt::Exception*>
                ((vector<wabt::Exception*,std::allocator<wabt::Exception*>> *)&this->excepts,
                 __position_00,(Exception **)&import);
    }
    else {
      *__position_00._M_current = (Exception *)import;
      pppEVar1 = &(this->excepts).
                  super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + 1;
    }
    p_Var12 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
               *)&this->except_bindings;
    this->num_except_imports = this->num_except_imports + 1;
    break;
  default:
    goto switchD_00f47b47_default;
  }
  iVar13 = (int)(uVar14 >> 3);
  if (iVar13 != -1) {
    if (_Var8._M_head_impl[1].module_name._M_dataplus._M_p != (pointer)0x0) {
      pIVar9 = (field->_M_t).
               super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl;
      import = (Import *)
               (((Location *)
                ((long)&(pIVar9->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField
                + 0x18))->filename).data_;
      uStack_50 = *(undefined4 *)
                   ((long)&(pIVar9->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                           super_ModuleField + 0x20);
      uStack_4c = *(undefined4 *)
                   ((long)&(pIVar9->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                           super_ModuleField + 0x24);
      local_48 = (((anon_union_16_2_ecfd7102_for_Location_1 *)
                  ((long)&(pIVar9->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                          super_ModuleField + 0x28))->field_0).line;
      uStack_44 = *(undefined4 *)
                   ((long)&(pIVar9->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                           super_ModuleField + 0x2c);
      uStack_40 = *(undefined4 *)
                   ((long)&(pIVar9->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                           super_ModuleField + 0x30);
      uStack_3c = *(undefined4 *)
                   ((long)&(pIVar9->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                           super_ModuleField + 0x34);
      local_38 = iVar13;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string_const&,wabt::Binding>(p_Var12,0,_Var8._M_head_impl + 1);
    }
    __position_04._M_current =
         (this->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position_04._M_current ==
        (this->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Import*,std::allocator<wabt::Import*>>::
      _M_realloc_insert<wabt::Import*const&>
                ((vector<wabt::Import*,std::allocator<wabt::Import*>> *)&this->imports,__position_04
                 ,(Import **)&local_60);
    }
    else {
      *__position_04._M_current = _Var8._M_head_impl;
      pppIVar7 = &(this->imports).
                  super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppIVar7 = *pppIVar7 + 1;
    }
    pIVar9 = (field->_M_t).
             super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
             .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl;
    (field->_M_t).
    super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>.
    _M_t.
    super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
    .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl = (ImportModuleField *)0x0
    ;
    if ((*(ModuleField **)
          ((long)&(pIVar9->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField +
          0x10) == (ModuleField *)0x0) &&
       (((intrusive_list_base<wabt::ModuleField> *)
        ((long)&(pIVar9->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField + 8))->
        next_ == (ModuleField *)0x0)) {
      pMVar10 = (this->fields).last_;
      if (pMVar10 == (ModuleField *)0x0) {
        pMVar11 = &this->fields;
      }
      else {
        *(ModuleField **)
         ((long)&(pIVar9->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField + 0x10
         ) = pMVar10;
        pMVar11 = (ModuleFieldList *)&pMVar10->super_intrusive_list_base<wabt::ModuleField>;
      }
      pMVar11->first_ = (ModuleField *)pIVar9;
      (this->fields).last_ = (ModuleField *)pIVar9;
      psVar2 = &(this->fields).size_;
      *psVar2 = *psVar2 + 1;
      return;
    }
    __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                  ,0x1bf,
                  "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
                 );
  }
switchD_00f47b47_default:
  __assert_fail("name && bindings && index != kInvalidIndex",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.cc"
                ,0x1c3,"void wabt::Module::AppendField(std::unique_ptr<ImportModuleField>)");
}

Assistant:

void Module::AppendField(std::unique_ptr<ImportModuleField> field) {
  Import* import = field->import.get();
  const std::string* name = nullptr;
  BindingHash* bindings = nullptr;
  Index index = kInvalidIndex;

  switch (import->kind()) {
    case ExternalKind::Func: {
      Func& func = cast<FuncImport>(import)->func;
      name = &func.name;
      bindings = &func_bindings;
      index = funcs.size();
      funcs.push_back(&func);
      ++num_func_imports;
      break;
    }

    case ExternalKind::Table: {
      Table& table = cast<TableImport>(import)->table;
      name = &table.name;
      bindings = &table_bindings;
      index = tables.size();
      tables.push_back(&table);
      ++num_table_imports;
      break;
    }

    case ExternalKind::Memory: {
      Memory& memory = cast<MemoryImport>(import)->memory;
      name = &memory.name;
      bindings = &memory_bindings;
      index = memories.size();
      memories.push_back(&memory);
      ++num_memory_imports;
      break;
    }

    case ExternalKind::Global: {
      Global& global = cast<GlobalImport>(import)->global;
      name = &global.name;
      bindings = &global_bindings;
      index = globals.size();
      globals.push_back(&global);
      ++num_global_imports;
      break;
    }

    case ExternalKind::Except: {
      Exception& except = cast<ExceptionImport>(import)->except;
      name = &except.name;
      bindings = &except_bindings;
      index = excepts.size();
      excepts.push_back(&except);
      ++num_except_imports;
      break;
    }
  }

  assert(name && bindings && index != kInvalidIndex);
  if (!name->empty()) {
    bindings->emplace(*name, Binding(field->loc, index));
  }
  imports.push_back(import);
  fields.push_back(std::move(field));
}